

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O2

void __thiscall rw::AnimInterpolator::addTime(AnimInterpolator *this,float32 t)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  AnimInterpolator *pAVar8;
  AnimInterpolator *pAVar9;
  AnimInterpolator *pAVar10;
  Animation *pAVar11;
  float fVar12;
  
  if (0.0 < (float)t) {
    fVar12 = (float)t + (float)this->currentTime;
    this->currentTime = (float32)fVar12;
    pAVar11 = this->currentAnim;
    if ((float)pAVar11->duration <= fVar12 && fVar12 != (float)pAVar11->duration) {
      setCurrentAnim(this,pAVar11);
      return;
    }
    iVar4 = pAVar11->numFrames;
    iVar1 = this->currentAnimKeyFrameSize;
    pvVar2 = pAVar11->keyframes;
    plVar5 = (long *)this->nextFrame;
    uVar3 = this->numNodes;
    pAVar10 = (AnimInterpolator *)0x0;
    uVar6 = 0;
    if (0 < (int)uVar3) {
      uVar6 = (ulong)uVar3;
    }
    while ((plVar5 < (long *)((long)iVar4 * (long)iVar1 + (long)pvVar2) &&
           ((float)((Animation *)*plVar5)->numFrames <= fVar12))) {
      lVar7 = uVar6 + 1;
      pAVar8 = this + 1;
      do {
        lVar7 = lVar7 + -1;
        if (lVar7 == 0) {
          pAVar11 = *(Animation **)&pAVar10->currentTime;
          goto LAB_00102c9a;
        }
        pAVar9 = (AnimInterpolator *)
                 ((long)&pAVar8->currentAnim + (long)this->currentInterpKeyFrameSize);
        pAVar11 = *(Animation **)&pAVar8->currentTime;
        pAVar10 = pAVar8;
        pAVar8 = pAVar9;
      } while (pAVar11 != (Animation *)*plVar5);
      pAVar10 = (AnimInterpolator *)((long)pAVar9 - (long)this->currentInterpKeyFrameSize);
LAB_00102c9a:
      pAVar10->currentAnim = pAVar11;
      *(long **)&pAVar10->currentTime = plVar5;
      plVar5 = (long *)((long)plVar5 + (long)iVar1);
      this->nextFrame = plVar5;
    }
    for (iVar4 = 0; iVar4 < (int)uVar3; iVar4 = iVar4 + 1) {
      lVar7 = (long)iVar4 * (long)this->currentInterpKeyFrameSize;
      (*this->interpCB)((Animation **)((long)&this[1].currentAnim + lVar7),
                        *(Animation **)((long)&this[1].currentAnim + lVar7),
                        *(void **)((long)&this[1].currentTime + lVar7),this->currentTime,
                        this->currentAnim->customData);
      uVar3 = this->numNodes;
    }
  }
  return;
}

Assistant:

void
AnimInterpolator::addTime(float32 t)
{
	int32 i;
	if(t <= 0.0f)
		return;
	this->currentTime += t;
	// reset animation
	if(this->currentTime > this->currentAnim->duration){
		this->setCurrentAnim(this->currentAnim);
		return;
	}
	KeyFrameHeader *last = this->getAnimFrame(this->currentAnim->numFrames);
	KeyFrameHeader *next = (KeyFrameHeader*)this->nextFrame;
	InterpFrameHeader *ifrm = nil;
	while(next < last && next->prev->time <= this->currentTime){
		// find next interpolation frame to expire
		for(i = 0; i < this->numNodes; i++){
			ifrm = this->getInterpFrame(i);
			if(ifrm->keyFrame2 == next->prev)
				break;
		}
		// advance interpolation frame
		ifrm->keyFrame1 = ifrm->keyFrame2;
		ifrm->keyFrame2 = next;
		// ... and next frame
		next = (KeyFrameHeader*)((uint8*)this->nextFrame +
		                         currentAnimKeyFrameSize);
		this->nextFrame = next;
	}
	for(i = 0; i < this->numNodes; i++){
		ifrm = this->getInterpFrame(i);
		this->interpCB(ifrm, ifrm->keyFrame1, ifrm->keyFrame2,
		               this->currentTime,
		               this->currentAnim->customData);
	}
}